

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printRoundingControl(MCInst *MI,uint Op,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  SStream *ss;
  uint in_ESI;
  MCInst *in_RDI;
  int64_t Imm;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar1 = MCOperand_getImm(op);
  ss = (SStream *)(ulong)((uint)iVar1 & 3);
  switch(ss) {
  case (SStream *)0x0:
    SStream_concat0(ss,(char *)ss);
    op_addAvxSae(in_RDI);
    op_addAvxRoundingMode(in_RDI,1);
    break;
  case (SStream *)0x1:
    SStream_concat0(ss,(char *)ss);
    op_addAvxSae(in_RDI);
    op_addAvxRoundingMode(in_RDI,2);
    break;
  case (SStream *)0x2:
    SStream_concat0(ss,(char *)ss);
    op_addAvxSae(in_RDI);
    op_addAvxRoundingMode(in_RDI,3);
    break;
  case (SStream *)0x3:
    SStream_concat0(ss,(char *)ss);
    op_addAvxSae(in_RDI);
    op_addAvxRoundingMode(in_RDI,4);
  }
  return;
}

Assistant:

static void printRoundingControl(MCInst *MI, unsigned Op, SStream *O)
{
	int64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, Op)) & 0x3;
	switch (Imm) {
		case 0: SStream_concat0(O, "{rn-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RN); break;
		case 1: SStream_concat0(O, "{rd-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RD); break;
		case 2: SStream_concat0(O, "{ru-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RU); break;
		case 3: SStream_concat0(O, "{rz-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RZ); break;
		default: break;	// nev0er reach
	}
}